

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.h
# Opt level: O0

void __thiscall xLearn::LinearScore::~LinearScore(LinearScore *this)

{
  Score::~Score((Score *)0x13aa2e);
  return;
}

Assistant:

~LinearScore() { }